

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::LossLayer::MergeFrom(LossLayer *this,LossLayer *from)

{
  void *pvVar1;
  string *initial_value;
  string *psVar2;
  LogMessage *other;
  CategoricalCrossEntropyLossLayer *this_00;
  MeanSquaredErrorLossLayer *this_01;
  CategoricalCrossEntropyLossLayer *from_00;
  MeanSquaredErrorLossLayer *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x11e62);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  initial_value = (from->name_).ptr_;
  if ((initial_value->_M_string_length != 0) &&
     (psVar2 = (this->name_).ptr_, psVar2 != initial_value)) {
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  if (from->_oneof_case_[0] != 0xb) {
    if (from->_oneof_case_[0] != 10) {
      return;
    }
    if (this->_oneof_case_[0] == 10) {
      this_00 = (this->LossLayerType_).categoricalcrossentropylosslayer_;
    }
    else {
      clear_LossLayerType(this);
      this->_oneof_case_[0] = 10;
      this_00 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
      CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer(this_00);
      (this->LossLayerType_).categoricalcrossentropylosslayer_ = this_00;
      if (from->_oneof_case_[0] != 10) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (CategoricalCrossEntropyLossLayer *)
                  &_CategoricalCrossEntropyLossLayer_default_instance_;
        goto LAB_00251b93;
      }
    }
    from_00 = (from->LossLayerType_).categoricalcrossentropylosslayer_;
LAB_00251b93:
    CategoricalCrossEntropyLossLayer::MergeFrom(this_00,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 0xb) {
    this_01 = (this->LossLayerType_).meansquarederrorlosslayer_;
  }
  else {
    clear_LossLayerType(this);
    this->_oneof_case_[0] = 0xb;
    this_01 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
    MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_01);
    (this->LossLayerType_).meansquarederrorlosslayer_ = this_01;
    if (from->_oneof_case_[0] != 0xb) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (MeanSquaredErrorLossLayer *)&_MeanSquaredErrorLossLayer_default_instance_;
      goto LAB_00251ba9;
    }
  }
  from_01 = (from->LossLayerType_).meansquarederrorlosslayer_;
LAB_00251ba9:
  MeanSquaredErrorLossLayer::MergeFrom(this_01,from_01);
  return;
}

Assistant:

void LossLayer::MergeFrom(const LossLayer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LossLayer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.name().size() > 0) {

    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  switch (from.LossLayerType_case()) {
    case kCategoricalCrossEntropyLossLayer: {
      mutable_categoricalcrossentropylosslayer()->::CoreML::Specification::CategoricalCrossEntropyLossLayer::MergeFrom(from.categoricalcrossentropylosslayer());
      break;
    }
    case kMeanSquaredErrorLossLayer: {
      mutable_meansquarederrorlosslayer()->::CoreML::Specification::MeanSquaredErrorLossLayer::MergeFrom(from.meansquarederrorlosslayer());
      break;
    }
    case LOSSLAYERTYPE_NOT_SET: {
      break;
    }
  }
}